

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

int __thiscall
gl3cts::TransformFeedbackOverflowQueryBaseTest::init
          (TransformFeedbackOverflowQueryBaseTest *this,EVP_PKEY_CTX *ctx)

{
  ContextInfo *pCVar1;
  bool bVar2;
  GLuint GVar3;
  undefined7 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  bVar2 = featureSupported(this);
  if (bVar2) {
    bVar2 = supportsTransformFeedback3(this);
    GVar3 = (GLuint)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      pCVar1 = ((this->super_TestCase).m_context)->m_contextInfo;
      GVar3 = (*pCVar1->_vptr_ContextInfo[2])(pCVar1,0x8e71);
      this->m_max_vertex_streams = GVar3;
    }
    return GVar3;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "Required transform_feedback_overflow_query extension is not supported",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual void init()
	{
		if (!featureSupported())
		{
			throw tcu::NotSupportedError("Required transform_feedback_overflow_query extension is not supported");
		}

		if (supportsTransformFeedback3())
		{
			m_max_vertex_streams = (GLuint)m_context.getContextInfo().getInt(GL_MAX_VERTEX_STREAMS);
		}
	}